

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

bool slang::ast::isValidForceLVal(Expression *expr,ASTContext *context,bool inSelect)

{
  SourceRange sourceRange;
  byte bVar1;
  bool bVar2;
  Symbol *pSVar3;
  NetSymbol *pNVar4;
  MemberAccessExpression *this;
  ElementSelectExpression *this_00;
  RangeSelectExpression *this_01;
  ConcatenationExpression *this_02;
  reference ppEVar5;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *this_03;
  byte in_DL;
  Expression *in_RSI;
  Expression *in_RDI;
  Expression *op;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  Symbol *sym;
  Expression *in_stack_ffffffffffffff90;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_60;
  ASTContext *in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffb0;
  SourceLocation in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd4;
  Expression *in_stack_ffffffffffffffd8;
  undefined1 uVar6;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = in_DL & 1;
  this_03 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
            (ulong)(in_RDI->kind - NamedValue);
  switch(this_03) {
  case (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x0:
  case (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x1:
    pSVar3 = Expression::getSymbolReference
                       (in_stack_ffffffffffffffd8,SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
    if (pSVar3 != (Symbol *)0x0) {
      if (((bVar1 & 1) != 0) && (bVar2 = VariableSymbol::isKind(pSVar3->kind), bVar2)) {
        return false;
      }
      if (pSVar3->kind == Net) {
        pNVar4 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0xbea64a);
        bVar2 = NetType::isBuiltIn(pNVar4->netType);
        if (!bVar2) {
          sourceRange.endLoc = in_stack_ffffffffffffffb8;
          sourceRange.startLoc = in_stack_ffffffffffffffb0;
          ASTContext::addDiag(in_stack_ffffffffffffffa8,SUB84((in_RDI->sourceRange).startLoc,4),
                              sourceRange);
        }
      }
    }
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x7:
    this_02 = Expression::as<slang::ast::ConcatenationExpression>(in_RDI);
    ConcatenationExpression::operands(this_02);
    local_60._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin(this_03);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              (in_stack_ffffffffffffff98);
    while (bVar2 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff90,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)this_03), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*(&local_60);
      in_stack_ffffffffffffff90 = *ppEVar5;
      bVar2 = isValidForceLVal(in_RSI,(ASTContext *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                               SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0));
      if (!bVar2) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_60);
    }
    local_1 = true;
    break;
  case (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xa:
    this_00 = Expression::as<slang::ast::ElementSelectExpression>(in_RDI);
    uVar6 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
    ElementSelectExpression::value(this_00);
    local_1 = isValidForceLVal(in_RSI,(ASTContext *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                               (bool)uVar6);
    break;
  case (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xb:
    this_01 = Expression::as<slang::ast::RangeSelectExpression>(in_RDI);
    uVar6 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
    RangeSelectExpression::value(this_01);
    local_1 = isValidForceLVal(in_RSI,(ASTContext *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                               (bool)uVar6);
    break;
  case (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xc:
    this = Expression::as<slang::ast::MemberAccessExpression>(in_RDI);
    uVar6 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
    MemberAccessExpression::value(this);
    local_1 = isValidForceLVal(in_RSI,(ASTContext *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                               (bool)uVar6);
  }
  return local_1;
}

Assistant:

static bool isValidForceLVal(const Expression& expr, const ASTContext& context, bool inSelect) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            if (auto sym = expr.getSymbolReference()) {
                if (inSelect && VariableSymbol::isKind(sym->kind))
                    return false;

                if (sym->kind == SymbolKind::Net && !sym->as<NetSymbol>().netType.isBuiltIn())
                    context.addDiag(diag::BadForceNetType, expr.sourceRange);
            }
            return true;
        case ExpressionKind::MemberAccess:
            return isValidForceLVal(expr.as<MemberAccessExpression>().value(), context, true);
        case ExpressionKind::ElementSelect:
            return isValidForceLVal(expr.as<ElementSelectExpression>().value(), context, true);
        case ExpressionKind::RangeSelect:
            return isValidForceLVal(expr.as<RangeSelectExpression>().value(), context, true);
        case ExpressionKind::Concatenation:
            for (auto op : expr.as<ConcatenationExpression>().operands()) {
                if (!isValidForceLVal(*op, context, false))
                    return false;
            }
            return true;
        default:
            return false;
    }
}